

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::FramebufferIncompleteLayereTargetsCase::iterate
          (FramebufferIncompleteLayereTargetsCase *this)

{
  deUint32 *pdVar1;
  pointer pcVar2;
  ostringstream *poVar3;
  TestLog *pTVar4;
  int iVar5;
  GLenum GVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  CallLogWrapper gl;
  ScopedLogSection section;
  Framebuffer fbo;
  Texture texture1;
  Texture texture0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  iVar5 = (*((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar5),
             ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
              super_TestNode.m_testCtx)->m_log);
  gl.m_enableLog = true;
  tcu::TestContext::setTestResult
            ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
             super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  pTVar4 = ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
            super_TestNode.m_testCtx)->m_log;
  pcVar2 = local_1b0 + 0x10;
  local_1b0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"LayerAndNonLayer","");
  pdVar1 = &fbo.super_ObjectWrapper.m_object;
  fbo.super_ObjectWrapper.m_gl = (Functions *)pdVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&fbo,"Layered and non-layered","");
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar4,(string *)local_1b0,(string *)&fbo);
  if (fbo.super_ObjectWrapper.m_gl != (Functions *)pdVar1) {
    operator_delete(fbo.super_ObjectWrapper.m_gl,
                    CONCAT44(fbo.super_ObjectWrapper._20_4_,fbo.super_ObjectWrapper.m_object) + 1);
  }
  if ((pointer)local_1b0._0_8_ != pcVar2) {
    operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
  }
  iVar5 = (*((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  pOVar7 = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
  glu::ObjectWrapper::ObjectWrapper
            (&fbo.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_00,iVar5),pOVar7);
  iVar5 = (*((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  pOVar7 = glu::objectTraits(OBJECTTYPE_TEXTURE);
  glu::ObjectWrapper::ObjectWrapper
            (&texture0.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_01,iVar5),pOVar7);
  iVar5 = (*((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  pOVar7 = glu::objectTraits(OBJECTTYPE_TEXTURE);
  glu::ObjectWrapper::ObjectWrapper
            (&texture1.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_02,iVar5),pOVar7);
  glu::CallLogWrapper::glBindTexture(&gl,0x8c1a,texture0.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glTexImage3D(&gl,0x8c1a,0,0x8058,0x20,0x20,0x20,0,0x1908,0x1401,(void *)0x0);
  glu::CallLogWrapper::glTexParameteri(&gl,0x8c1a,0x2800,0x2600);
  glu::CallLogWrapper::glTexParameteri(&gl,0x8c1a,0x2801,0x2600);
  glu::CallLogWrapper::glBindTexture(&gl,0x8c1a,texture1.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glTexImage3D(&gl,0x8c1a,0,0x8058,0x20,0x20,0x20,0,0x1908,0x1401,(void *)0x0);
  glu::CallLogWrapper::glTexParameteri(&gl,0x8c1a,0x2800,0x2600);
  glu::CallLogWrapper::glTexParameteri(&gl,0x8c1a,0x2801,0x2600);
  glu::CallLogWrapper::glBindFramebuffer(&gl,0x8ca9,fbo.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glFramebufferTexture
            (&gl,0x8ca9,0x8ce0,texture0.super_ObjectWrapper.m_object,0);
  glu::CallLogWrapper::glFramebufferTextureLayer
            (&gl,0x8ca9,0x8ce1,texture1.super_ObjectWrapper.m_object,0,0);
  GVar6 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar6,"setup fbo",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x1435);
  GVar6 = glu::CallLogWrapper::glCheckFramebufferStatus(&gl,0x8ca9);
  local_1b0._0_8_ =
       ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  poVar3 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Framebuffer status: ",0x14);
  local_1c0.m_getName = glu::getFramebufferStatusName;
  local_1c0.m_value = GVar6;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar3);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_138);
  if (GVar6 != 0x8da8) {
    local_1b0._0_8_ =
         ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar3 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,"Error, expected GL_FRAMEBUFFER_INCOMPLETE_LAYER_TARGETS, got ",
               0x3d);
    local_1c0.m_getName = glu::getFramebufferStatusName;
    local_1c0.m_value = GVar6;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar3);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_138);
    tcu::TestContext::setTestResult
              ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
               super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"invalid layer count");
  }
  glu::ObjectWrapper::~ObjectWrapper(&texture1.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&texture0.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&fbo.super_ObjectWrapper);
  tcu::TestLog::endSection(section.m_log);
  pTVar4 = ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
            super_TestNode.m_testCtx)->m_log;
  local_1b0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"DifferentTarget","");
  fbo.super_ObjectWrapper.m_gl = (Functions *)pdVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&fbo,"Different target","");
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar4,(string *)local_1b0,(string *)&fbo);
  if (fbo.super_ObjectWrapper.m_gl != (Functions *)pdVar1) {
    operator_delete(fbo.super_ObjectWrapper.m_gl,
                    CONCAT44(fbo.super_ObjectWrapper._20_4_,fbo.super_ObjectWrapper.m_object) + 1);
  }
  if ((pointer)local_1b0._0_8_ != pcVar2) {
    operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
  }
  iVar5 = (*((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  pOVar7 = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
  glu::ObjectWrapper::ObjectWrapper
            (&fbo.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_03,iVar5),pOVar7);
  iVar5 = (*((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  pOVar7 = glu::objectTraits(OBJECTTYPE_TEXTURE);
  glu::ObjectWrapper::ObjectWrapper
            (&texture0.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_04,iVar5),pOVar7);
  iVar5 = (*((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  pOVar7 = glu::objectTraits(OBJECTTYPE_TEXTURE);
  glu::ObjectWrapper::ObjectWrapper
            (&texture1.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_05,iVar5),pOVar7);
  glu::CallLogWrapper::glBindTexture(&gl,0x8c1a,texture0.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glTexImage3D(&gl,0x8c1a,0,0x8058,0x20,0x20,0x20,0,0x1908,0x1401,(void *)0x0);
  glu::CallLogWrapper::glTexParameteri(&gl,0x8c1a,0x2800,0x2600);
  glu::CallLogWrapper::glTexParameteri(&gl,0x8c1a,0x2801,0x2600);
  glu::CallLogWrapper::glBindTexture(&gl,0x806f,texture1.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glTexImage3D(&gl,0x806f,0,0x8058,0x20,0x20,0x20,0,0x1908,0x1401,(void *)0x0);
  glu::CallLogWrapper::glTexParameteri(&gl,0x806f,0x2800,0x2600);
  glu::CallLogWrapper::glTexParameteri(&gl,0x806f,0x2801,0x2600);
  glu::CallLogWrapper::glBindFramebuffer(&gl,0x8ca9,fbo.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glFramebufferTexture
            (&gl,0x8ca9,0x8ce0,texture0.super_ObjectWrapper.m_object,0);
  glu::CallLogWrapper::glFramebufferTexture
            (&gl,0x8ca9,0x8ce1,texture1.super_ObjectWrapper.m_object,0);
  GVar6 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar6,"setup fbo",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x1457);
  GVar6 = glu::CallLogWrapper::glCheckFramebufferStatus(&gl,0x8ca9);
  local_1b0._0_8_ =
       ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  poVar3 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Framebuffer status: ",0x14);
  local_1c0.m_getName = glu::getFramebufferStatusName;
  local_1c0.m_value = GVar6;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar3);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_138);
  if (GVar6 != 0x8da8) {
    local_1b0._0_8_ =
         ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar3 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,"Error, expected GL_FRAMEBUFFER_INCOMPLETE_LAYER_TARGETS, got ",
               0x3d);
    local_1c0.m_getName = glu::getFramebufferStatusName;
    local_1c0.m_value = GVar6;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar3);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_138);
    tcu::TestContext::setTestResult
              ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
               super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"invalid layer count");
  }
  glu::ObjectWrapper::~ObjectWrapper(&texture1.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&texture0.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&fbo.super_ObjectWrapper);
  tcu::TestLog::endSection(section.m_log);
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  return STOP;
}

Assistant:

FramebufferIncompleteLayereTargetsCase::IterateResult FramebufferIncompleteLayereTargetsCase::iterate (void)
{
	glu::CallLogWrapper gl(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	gl.enableLogging(true);

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	{
		const tcu::ScopedLogSection section			(m_testCtx.getLog(), "LayerAndNonLayer", "Layered and non-layered");
		const glu::Framebuffer		fbo				(m_context.getRenderContext());
		const glu::Texture			texture0		(m_context.getRenderContext());
		const glu::Texture			texture1		(m_context.getRenderContext());

		glw::GLint					fboStatus;

		gl.glBindTexture(GL_TEXTURE_2D_ARRAY, *texture0);
		gl.glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, GL_RGBA8, 32, 32, 32, 0, GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL);
		gl.glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		gl.glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);

		gl.glBindTexture(GL_TEXTURE_2D_ARRAY, *texture1);
		gl.glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, GL_RGBA8, 32, 32, 32, 0, GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL);
		gl.glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		gl.glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);

		gl.glBindFramebuffer(GL_DRAW_FRAMEBUFFER, *fbo);
		gl.glFramebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, *texture0, 0);
		gl.glFramebufferTextureLayer(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT1, *texture1, 0, 0);

		GLU_EXPECT_NO_ERROR(gl.glGetError(), "setup fbo");

		fboStatus = gl.glCheckFramebufferStatus(GL_DRAW_FRAMEBUFFER);
		m_testCtx.getLog() << tcu::TestLog::Message << "Framebuffer status: " << glu::getFramebufferStatusStr(fboStatus) << tcu::TestLog::EndMessage;

		if (fboStatus != GL_FRAMEBUFFER_INCOMPLETE_LAYER_TARGETS)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Error, expected GL_FRAMEBUFFER_INCOMPLETE_LAYER_TARGETS, got " << glu::getFramebufferStatusStr(fboStatus) << tcu::TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "invalid layer count");
		}
	}

	{
		const tcu::ScopedLogSection section			(m_testCtx.getLog(), "DifferentTarget", "Different target");
		const glu::Framebuffer		fbo				(m_context.getRenderContext());
		const glu::Texture			texture0		(m_context.getRenderContext());
		const glu::Texture			texture1		(m_context.getRenderContext());

		glw::GLint					fboStatus;

		gl.glBindTexture(GL_TEXTURE_2D_ARRAY, *texture0);
		gl.glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, GL_RGBA8, 32, 32, 32, 0, GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL);
		gl.glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		gl.glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);

		gl.glBindTexture(GL_TEXTURE_3D, *texture1);
		gl.glTexImage3D(GL_TEXTURE_3D, 0, GL_RGBA8, 32, 32, 32, 0, GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL);
		gl.glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		gl.glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);

		gl.glBindFramebuffer(GL_DRAW_FRAMEBUFFER, *fbo);
		gl.glFramebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, *texture0, 0);
		gl.glFramebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT1, *texture1, 0);

		GLU_EXPECT_NO_ERROR(gl.glGetError(), "setup fbo");

		fboStatus = gl.glCheckFramebufferStatus(GL_DRAW_FRAMEBUFFER);
		m_testCtx.getLog() << tcu::TestLog::Message << "Framebuffer status: " << glu::getFramebufferStatusStr(fboStatus) << tcu::TestLog::EndMessage;

		if (fboStatus != GL_FRAMEBUFFER_INCOMPLETE_LAYER_TARGETS)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Error, expected GL_FRAMEBUFFER_INCOMPLETE_LAYER_TARGETS, got " << glu::getFramebufferStatusStr(fboStatus) << tcu::TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "invalid layer count");
		}
	}

	return STOP;
}